

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::join_tx_rx_thread(CommsInterface *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> syncLock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  if (((in_RDI[0xf].super___mutex_base._M_mutex.__size[1] & 1U) == 0) &&
     (bVar1 = std::thread::joinable((thread *)in_stack_ffffffffffffffe0), bVar1)) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable((thread *)in_stack_ffffffffffffffe0);
  if (bVar1) {
    std::thread::join();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4f59ba);
  return;
}

Assistant:

void CommsInterface::join_tx_rx_thread()
{
    const std::lock_guard<std::mutex> syncLock(threadSyncLock);
    if (!singleThread) {
        if (queue_watcher.joinable()) {
            queue_watcher.join();
        }
    }
    if (queue_transmitter.joinable()) {
        queue_transmitter.join();
    }
}